

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_luv.c
# Opt level: O1

int LogL16Decode(TIFF *tif,uint8_t *op,tmsize_t occ,uint16_t s)

{
  byte bVar1;
  uint8_t *puVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  undefined6 in_register_0000000a;
  uint uVar6;
  int iVar7;
  byte *pbVar8;
  byte *pbVar9;
  uint8_t *p;
  tmsize_t tVar10;
  bool bVar11;
  
  if ((int)CONCAT62(in_register_0000000a,s) != 0) {
    __assert_fail("s == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_luv.c"
                  ,0xc5,"int LogL16Decode(TIFF *, uint8_t *, tmsize_t, uint16_t)");
  }
  puVar2 = tif->tif_data;
  if (puVar2 == (uint8_t *)0x0) {
    __assert_fail("sp != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_luv.c"
                  ,0xc6,"int LogL16Decode(TIFF *, uint8_t *, tmsize_t, uint16_t)");
  }
  lVar3 = occ / (long)*(int *)(puVar2 + 0xc);
  p = op;
  if (*(int *)(puVar2 + 4) != 1) {
    if (*(long *)(puVar2 + 0x18) < lVar3) {
      TIFFErrorExtR(tif,"LogL16Decode","Translation buffer too short");
      return 0;
    }
    p = *(uint8_t **)(puVar2 + 0x10);
  }
  _TIFFmemset(p,0,lVar3 * 2);
  pbVar9 = tif->tif_rawcp;
  tVar10 = tif->tif_rawcc;
  iVar5 = 8;
  while ((lVar3 < 1 || (tVar10 < 1))) {
    lVar4 = 0;
LAB_002ac926:
    if (lVar3 != lVar4) {
      TIFFErrorExtR(tif,"LogL16Decode","Not enough data at row %u (short %ld pixels)",
                    (ulong)tif->tif_row);
      tif->tif_rawcp = pbVar9;
      tif->tif_rawcc = tVar10;
      return 0;
    }
    bVar11 = iVar5 == 0;
    iVar5 = iVar5 + -8;
    if (bVar11) {
      (**(code **)(puVar2 + 0x20))(puVar2,op,lVar3);
      tif->tif_rawcp = pbVar9;
      tif->tif_rawcc = tVar10;
      return 1;
    }
  }
  lVar4 = 0;
  pbVar8 = pbVar9;
  do {
    uVar6 = (uint)*pbVar8;
    pbVar9 = pbVar8;
    if ((char)*pbVar8 < '\0') {
      if (tVar10 < 2) goto LAB_002ac926;
      pbVar9 = pbVar8 + 2;
      tVar10 = tVar10 + -2;
      if ((uVar6 != 0x7e) && (lVar4 < lVar3)) {
        bVar1 = pbVar8[1];
        iVar7 = uVar6 - 0x7f;
        do {
          *(ushort *)(p + lVar4 * 2) =
               *(ushort *)(p + lVar4 * 2) | (ushort)bVar1 << ((byte)iVar5 & 0x1f);
          lVar4 = lVar4 + 1;
          bVar11 = iVar7 == 0;
          iVar7 = iVar7 + -1;
          if (bVar11) break;
        } while (lVar4 < lVar3);
      }
    }
    else {
      while( true ) {
        pbVar9 = pbVar9 + 1;
        tVar10 = tVar10 + -1;
        if (tVar10 == 0) break;
        bVar11 = uVar6 == 0;
        uVar6 = uVar6 - 1;
        if ((bVar11) || (lVar3 <= lVar4)) goto LAB_002ac918;
        *(ushort *)(p + lVar4 * 2) =
             *(ushort *)(p + lVar4 * 2) | (ushort)*pbVar9 << ((byte)iVar5 & 0x1f);
        lVar4 = lVar4 + 1;
      }
      tVar10 = 0;
    }
LAB_002ac918:
    if ((lVar3 <= lVar4) || (pbVar8 = pbVar9, tVar10 < 1)) goto LAB_002ac926;
  } while( true );
}

Assistant:

static int LogL16Decode(TIFF *tif, uint8_t *op, tmsize_t occ, uint16_t s)
{
    static const char module[] = "LogL16Decode";
    LogLuvState *sp = DecoderState(tif);
    int shft;
    tmsize_t i;
    tmsize_t npixels;
    unsigned char *bp;
    int16_t *tp;
    int16_t b;
    tmsize_t cc;
    int rc;

    (void)s;
    assert(s == 0);
    assert(sp != NULL);

    npixels = occ / sp->pixel_size;

    if (sp->user_datafmt == SGILOGDATAFMT_16BIT)
        tp = (int16_t *)op;
    else
    {
        if (sp->tbuflen < npixels)
        {
            TIFFErrorExtR(tif, module, "Translation buffer too short");
            return (0);
        }
        tp = (int16_t *)sp->tbuf;
    }
    _TIFFmemset((void *)tp, 0, npixels * sizeof(tp[0]));

    bp = (unsigned char *)tif->tif_rawcp;
    cc = tif->tif_rawcc;
    /* get each byte string */
    for (shft = 8; shft >= 0; shft -= 8)
    {
        for (i = 0; i < npixels && cc > 0;)
        {
            if (*bp >= 128)
            { /* run */
                if (cc < 2)
                    break;
                rc = *bp++ + (2 - 128);
                b = (int16_t)(*bp++ << shft);
                cc -= 2;
                while (rc-- && i < npixels)
                    tp[i++] |= b;
            }
            else
            {               /* non-run */
                rc = *bp++; /* nul is noop */
                while (--cc && rc-- && i < npixels)
                    tp[i++] |= (int16_t)*bp++ << shft;
            }
        }
        if (i != npixels)
        {
            TIFFErrorExtR(tif, module,
                          "Not enough data at row %" PRIu32
                          " (short %" TIFF_SSIZE_FORMAT " pixels)",
                          tif->tif_row, npixels - i);
            tif->tif_rawcp = (uint8_t *)bp;
            tif->tif_rawcc = cc;
            return (0);
        }
    }
    (*sp->tfunc)(sp, op, npixels);
    tif->tif_rawcp = (uint8_t *)bp;
    tif->tif_rawcc = cc;
    return (1);
}